

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_Initialize(void)

{
  long nativeOne;
  PaError result;
  
  if (initializationCount_ == 0) {
    PaUtil_InitializeClock();
    nativeOne._4_4_ = InitializeHostApis();
    if (nativeOne._4_4_ == 0) {
      initializationCount_ = initializationCount_ + 1;
    }
  }
  else {
    initializationCount_ = initializationCount_ + 1;
    nativeOne._4_4_ = 0;
  }
  return nativeOne._4_4_;
}

Assistant:

PaError Pa_Initialize( void )
{
    PaError result;

    PA_LOGAPI_ENTER( "Pa_Initialize" );

    if( PA_IS_INITIALISED_ )
    {
        ++initializationCount_;
        result = paNoError;
    }
    else
    {
        PA_VALIDATE_TYPE_SIZES;
        PA_VALIDATE_ENDIANNESS;
        
        PaUtil_InitializeClock();
        PaUtil_ResetTraceMessages();

        result = InitializeHostApis();
        if( result == paNoError )
            ++initializationCount_;
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_Initialize", result );

    return result;
}